

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O3

size_t mfread(void *ptr,size_t size,size_t nmemb,mFILE *mf)

{
  ulong uVar1;
  ulong uVar2;
  ulong __n;
  ulong uVar3;
  
  if (m_channel_0 == mf) {
    init_mstdin();
  }
  uVar1 = mf->offset;
  uVar2 = mf->size - uVar1;
  if (uVar1 <= mf->size && uVar2 != 0) {
    uVar3 = nmemb * size;
    __n = uVar2;
    if (uVar3 < uVar2) {
      __n = uVar3;
    }
    if (size != 0) {
      memcpy(ptr,mf->data + uVar1,__n);
      mf->offset = mf->offset + __n;
      if (uVar2 <= uVar3 && uVar3 - uVar2 != 0) {
        mf->eof = 1;
      }
      return __n / size;
    }
  }
  return 0;
}

Assistant:

size_t mfread(void *ptr, size_t size, size_t nmemb, mFILE *mf) {
    size_t len;
    char *cptr = (char *)ptr;
    
    if (mf == m_channel[0]) init_mstdin();

    if (mf->size <= mf->offset)
	return 0;

    len = size * nmemb <= mf->size - mf->offset
	? size * nmemb
	: mf->size - mf->offset;
    if (!size)
	return 0;

    memcpy(cptr, &mf->data[mf->offset], len);
    mf->offset += len;
    
    if (len != size * nmemb) {
	mf->eof = 1;
    }

    return len / size;
}